

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputable.cpp
# Opt level: O2

uint32_t snestistics::calculateFormattingandSize
                   (uint8_t *data,bool acc16,bool ind16,char *target,char *targetLabel,
                   int *bitmodeNeeded)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  int nb;
  uint32_t uVar5;
  char *pcVar6;
  
  bVar1 = *data;
  iVar2 = *(int *)(opCodeInfo + (ulong)bVar1 * 0x18 + 0x10);
  if (bitmodeNeeded != (int *)0x0) {
    *bitmodeNeeded = 8;
  }
  if ((iVar2 == 1 && !acc16) || (iVar2 == 2 && !ind16)) {
    if (target == (char *)0x0) {
      return 2;
    }
    bVar1 = data[1];
    pcVar6 = "#$%02X";
LAB_001321b6:
    sprintf(target,pcVar6,(ulong)bVar1);
    return 2;
  }
  if ((bVar1 & 0xfd) == 0 && iVar2 == 3) {
    if (target == (char *)0x0) {
      return 2;
    }
    bVar1 = data[1];
    pcVar6 = "$%02X";
    goto LAB_001321b6;
  }
  lVar3 = (long)iVar2 * 0x20;
  if ((iVar2 != 4) || ((&branches)[bVar1] != '\x01')) {
    uVar5 = *(uint32_t *)(g_oplut + lVar3 + 4);
    if (bVar1 == 0x54) {
      if (uVar5 != 3) {
        __assert_fail("nb == 3",
                      "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/cputable.cpp"
                      ,0x87,
                      "uint32_t snestistics::calculateFormattingandSize(const uint8_t *, const bool, const bool, char *, char *, int *)"
                     );
      }
      if (target != (char *)0x0) {
        sprintf(target,*(char **)(g_oplut + lVar3 + 0x10),(ulong)data[1],(ulong)data[2]);
      }
      if (targetLabel != (char *)0x0) {
        strcpy(targetLabel,*(char **)(g_oplut + lVar3 + 0x18));
      }
      uVar5 = 3;
    }
    else {
      if (target != (char *)0x0) {
        sprintf(target,*(char **)(g_oplut + lVar3 + 0x10),(ulong)data[(long)(int)uVar5 + -1],
                (ulong)data[(long)(int)uVar5 + -2],(ulong)data[(long)(int)uVar5 + -3]);
      }
      if (targetLabel != (char *)0x0) {
        strcpy(targetLabel,*(char **)(g_oplut + lVar3 + 0x18));
      }
    }
    if (bitmodeNeeded == (int *)0x0) {
      return uVar5;
    }
    *bitmodeNeeded = *(int *)(g_oplut + lVar3 + 8);
    return uVar5;
  }
  bVar1 = data[1];
  uVar4 = (ulong)bVar1;
  if ((char)bVar1 < '\0') {
    if (target == (char *)0x0) goto LAB_001322c9;
    pcVar6 = "-$%02X";
    uVar4 = (ulong)(0x100 - bVar1);
  }
  else {
    if (target == (char *)0x0) goto LAB_001322c9;
    pcVar6 = "$%02X";
  }
  sprintf(target,pcVar6,uVar4);
LAB_001322c9:
  if (targetLabel == (char *)0x0) {
    return 2;
  }
  strcpy(targetLabel,*(char **)(g_oplut + lVar3 + 0x18));
  return 2;
}

Assistant:

uint32_t calculateFormattingandSize(const uint8_t * data, const bool acc16, const bool ind16, char * target, char * targetLabel, int * bitmodeNeeded) {
	const uint8_t opcode = data[0];
	const int am = opCodeInfo[opcode].adressMode;
	const AdressModeInfo &ami = g_oplut[am];
	if (bitmodeNeeded)
		*bitmodeNeeded = 8;

	// We have a few special cases that doesn't work with our simple table
	if (am == 1 && !acc16) {
		if (target) sprintf(target, "#$%02X", data[1]);
		return 2;
	}
	else if (am == 2 && !ind16) {
		if (target) sprintf(target, "#$%02X", data[1]);
		return 2;
	}
	else if (am == 3 && (opcode == 0 || opcode == 2)) {
		if (target) sprintf(target, "$%02X", data[1]);
		return 2;
	}
	else if (am == 4 && branches[opcode]) {
		int signed_offset = data[1];
		if (signed_offset >= 0x80)
			signed_offset -= 0x100;
		if (signed_offset >= 0) {
			if (target) sprintf(target, "$%02X", abs(signed_offset));
		}
		else {
			if (target) sprintf(target, "-$%02X", abs(signed_offset));
		}
		if (targetLabel) strcpy(targetLabel, ami.formattingWithLabelString);
		return 2;
	} if (opcode == 0x54) {
		// HACK: WLA DX specific reversal of parameter order, involve asmwrite_wladx so it can customize?
		const int nb = ami.numBytes;
		assert(nb == 3);
		const char * result = ami.formattingString;
		if (target) sprintf(target, result, data[1], data[2]);
		if (targetLabel) strcpy(targetLabel, ami.formattingWithLabelString);
		if (bitmodeNeeded) *bitmodeNeeded = ami.numBitsForOpcode;
		return nb;
	}
	else {
		const int nb = ami.numBytes;
		const char * result = ami.formattingString;
		if (target) sprintf(target, result, data[nb - 1], data[nb - 2], data[nb - 3]);
		if (targetLabel) strcpy(targetLabel, ami.formattingWithLabelString);
		if (bitmodeNeeded) *bitmodeNeeded = ami.numBitsForOpcode;
		return nb;
	}
}